

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::SPFForceManager::setDeltaLambda(SPFForceManager *this,RealType spfTarget)

{
  element_type *peVar1;
  long in_RDI;
  ulong in_XMM0_Qa;
  Vector3d *in_stack_00000008;
  Molecule *in_stack_00000010;
  shared_ptr<OpenMD::SPFData> currentSPFData;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_stack_00000058;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_stack_00000060;
  SPFMethod *in_stack_000000b0;
  Snapshot *in_stack_ffffffffffffffb8;
  SPFData *in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(in_RDI + 0xd38) & 1) != 0) {
    Snapshot::getSPFData(in_stack_ffffffffffffffb8);
    peVar1 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x35dc56);
    if ((1.0 <= peVar1->lambda) ||
       (peVar1 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x35dc73), ABS(peVar1->lambda - 1.0) < 1e-06)) {
      if (*(long *)(in_RDI + 0xd40) != 0) {
        in_stack_ffffffffffffffc0 = *(SPFData **)(in_RDI + 0xd40);
        std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x35dccb);
        Molecule::setCom(in_stack_00000010,in_stack_00000008);
        *(undefined8 *)(in_RDI + 0xd40) = 0;
      }
      std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x35dd13);
      SPFData::clear(in_stack_ffffffffffffffc0);
      *(undefined8 *)(in_RDI + 0xd50) = 0;
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
                 (vector<int,_std::allocator<int>_> *)in_stack_00000058);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_00000060,
                 (vector<int,_std::allocator<int>_> *)in_stack_00000058);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
                (in_stack_00000060,in_stack_00000058);
      *(undefined1 *)(in_RDI + 0xd38) = 0;
      SPFMethod::selectMolecule(in_stack_000000b0);
    }
    else {
      *(ulong *)(in_RDI + 0xd50) = in_XMM0_Qa & 0x7fffffffffffffff;
      peVar1 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x35ddcb);
      if (1.0 <= peVar1->lambda + *(double *)(in_RDI + 0xd50)) {
        peVar1 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x35ddf8);
        *(double *)(in_RDI + 0xd50) = 1.0 - peVar1->lambda;
      }
    }
    std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x35de27);
  }
  return;
}

Assistant:

void SPFForceManager::setDeltaLambda(RealType spfTarget) {
    if (hasSelectedMolecule_) {
      std::shared_ptr<SPFData> currentSPFData = currentSnapshot_->getSPFData();

      // Check to see if we are already fully in sink region
      if (currentSPFData->lambda >= 1.0 ||
          std::fabs(currentSPFData->lambda - 1.0) < 1e-6) {
        // Only the processor with the selected molecule should do this step:
        if (selectedMolecule_) {
          selectedMolecule_->setCom(currentSPFData->pos);
          selectedMolecule_ = nullptr;
        }

        currentSPFData->clear();
        deltaLambda_ = 0.0;

        neighborList_   = sinkNeighborList_;
        point_          = sinkPoint_;
        savedPositions_ = sinkSavedPositions_;

        hasSelectedMolecule_ = false;

        spfRNEMD_->selectMolecule();

        return;
      }

      // survived the return true, so lambda is not >= 1:
      // currentSPFTarget is an ion flux target, so can have sign:
      deltaLambda_ = std::fabs(spfTarget);

      if (currentSPFData->lambda + deltaLambda_ >= 1.0) {
        /*
         * New deltaLambda should be determined such that:
         *  f_lambda(lambda + deltaLambda) = 1
         */
        deltaLambda_ = 1.0 - currentSPFData->lambda;
      }
    }
  }